

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_resolv_cb(void *arg)

{
  nng_err nVar1;
  nni_aio *aio_00;
  char *pcVar2;
  int rv;
  nni_aio *aio;
  udp_pipe *p;
  udp_ep *ep;
  void *arg_local;
  
  p = (udp_pipe *)arg;
  ep = (udp_ep *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  aio_00 = (nni_aio *)nni_list_first((nni_list *)&p[7].rx_aios.ll_head.ln_prev);
  if (aio_00 == (nni_aio *)0x0) {
    nni_mtx_unlock((nni_mtx *)&p->npipe);
  }
  else if (((p->peer_addr).s_abstract.sa_name[0x22] & 1) == 0) {
    nVar1 = nni_aio_result((nni_aio *)&p[1].rx_mq);
    if (nVar1 == NNG_OK) {
      if (*(short *)&p[6].node.ln_prev == 0) {
        *(undefined2 *)&p[6].node.ln_prev = *(undefined2 *)((long)&p[7].peer_addr + 0x10);
      }
      if ((p->ep == (udp_ep *)0x0) &&
         (nVar1 = nni_plat_udp_open((nni_plat_udp **)p,(nni_sockaddr *)&p[6].node.ln_prev),
         nVar1 != NNG_OK)) {
        nni_aio_list_remove(aio_00);
        nni_mtx_unlock((nni_mtx *)&p->npipe);
        nni_aio_finish_error(aio_00,nVar1);
      }
      else {
        nVar1 = nni_pipe_alloc_dialer(&aio,(nni_dialer *)p[3].peer_addr.s_storage.sa_pad[4]);
        if (nVar1 != NNG_OK) {
          nni_aio_list_remove(aio_00);
          nni_mtx_unlock((nni_mtx *)&p->npipe);
          nni_aio_finish_error(aio_00,nVar1);
        }
        nVar1 = udp_pipe_start((udp_pipe *)aio,(udp_ep *)p,
                               (nng_sockaddr *)((long)&p[7].peer_addr + 0x10));
        if (nVar1 != NNG_OK) {
          nni_aio_list_remove(aio_00);
          nni_pipe_close((nni_pipe *)aio->a_expire);
          nni_mtx_unlock((nni_mtx *)&p->npipe);
          nni_aio_finish_error(aio_00,nVar1);
        }
        udp_pipe_schedule((udp_pipe *)aio);
        udp_ep_start((udp_ep *)p);
        udp_send_creq((udp_ep *)p,(udp_pipe *)aio);
        nni_mtx_unlock((nni_mtx *)&p->npipe);
      }
    }
    else {
      nni_aio_list_remove(aio_00);
      nni_mtx_unlock((nni_mtx *)&p->npipe);
      pcVar2 = nng_strerror(nVar1);
      nng_log_warn("NNG-UDP-RESOLV","Failed resolving IP address: %s",pcVar2);
      nni_aio_finish_error(aio_00,nVar1);
    }
  }
  else {
    nni_aio_list_remove(aio_00);
    nni_mtx_unlock((nni_mtx *)&p->npipe);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
udp_resolv_cb(void *arg)
{
	udp_ep   *ep = arg;
	udp_pipe *p;
	nni_aio  *aio;
	int       rv;
	nni_mtx_lock(&ep->mtx);
	if ((aio = nni_list_first(&ep->connaios)) == NULL) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (ep->closed) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if ((rv = nni_aio_result(&ep->resaio)) != 0) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nng_log_warn("NNG-UDP-RESOLV",
		    "Failed resolving IP address: %s", nng_strerror(rv));
		nni_aio_finish_error(aio, rv);
		return;
	}

	// Choose the right port to bind to. The family must match.
	if (ep->self_sa.s_family == NNG_AF_UNSPEC) {
		ep->self_sa.s_family = ep->peer_sa.s_family;
	}

	if (ep->udp == NULL) {
		if ((rv = nni_udp_open(&ep->udp, &ep->self_sa)) != 0) {
			nni_aio_list_remove(aio);
			nni_mtx_unlock(&ep->mtx);
			nni_aio_finish_error(aio, rv);
			return;
		}
	}

	// places a "hold" on the ep
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, rv);
	}
	if ((rv = udp_pipe_start(p, ep, &ep->peer_sa)) != 0) {
		nni_aio_list_remove(aio);
		nni_pipe_close(p->npipe);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, rv);
	}

	udp_pipe_schedule(p);
	udp_ep_start(ep);

	// Send out the connection request.  We don't complete
	// the user aio until we confirm a connection, so that
	// we can supply details like maximum receive message size
	// and the protocol the peer is using.
	udp_send_creq(ep, p);
	nni_mtx_unlock(&ep->mtx);
}